

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternparser.cpp
# Opt level: O0

void __thiscall
PatternParser::parseVariablePattern
          (PatternParser *this,Pattern *pattern,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  Pattern *pPVar1;
  bool bVar2;
  size_type sVar3;
  InputError *pIVar4;
  string local_160 [38];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [39];
  undefined1 local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [36];
  int local_cc;
  double dStack_c8;
  int i;
  double factor;
  int seconds;
  string timeUnits;
  allocator local_91;
  string local_90 [32];
  VariablePattern *local_70;
  VariablePattern *varPat;
  string *tokens;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Pattern *pattern_local;
  PatternParser *this_local;
  
  pvStack_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)pattern;
  pattern_local = (Pattern *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  local_24 = (int)sVar3;
  if (local_24 < 2) {
    tokens._3_1_ = 1;
    pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
    InputError::InputError(pIVar4,2,(string *)local_48);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
  }
  varPat = (VariablePattern *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](pvStack_20,0);
  local_70 = (VariablePattern *)tokenList_local;
  pPVar1 = &varPat->super_Pattern;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"VARIABLE",&local_91);
  bVar2 = Utilities::match((string *)&(pPVar1->super_Element).field_0x20,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&seconds,"",(allocator *)((long)&factor + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&factor + 7));
    for (local_cc = 1; local_cc < local_24; local_cc = local_cc + 1) {
      factor._0_4_ = Utilities::getSeconds
                               ((string *)
                                (&(varPat->super_Pattern).super_Element._vptr_Element +
                                (long)local_cc * 4),(string *)&seconds);
      if (factor._0_4_ < 0) {
        local_111 = 1;
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::operator+(local_110,
                       (char *)(&(varPat->super_Pattern).super_Element._vptr_Element +
                               (long)local_cc * 4));
        std::operator+(local_f0,local_110);
        InputError::InputError(pIVar4,7,local_f0);
        local_111 = 0;
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      local_cc = local_cc + 1;
      if (local_24 <= local_cc) {
        local_13a = 1;
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_138,"",&local_139);
        InputError::InputError(pIVar4,2,(string *)local_138);
        local_13a = 0;
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      bVar2 = Utilities::parseNumber<double>
                        ((string *)
                         (&(varPat->super_Pattern).super_Element._vptr_Element + (long)local_cc * 4)
                         ,&stack0xffffffffffffff38);
      if (!bVar2) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  (local_160,
                   (string *)
                   (&(varPat->super_Pattern).super_Element._vptr_Element + (long)local_cc * 4));
        InputError::InputError(pIVar4,6,(string *)local_160);
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      VariablePattern::addTime(local_70,factor._0_4_);
      Pattern::addFactor(&local_70->super_Pattern,dStack_c8);
    }
    std::__cxx11::string::~string((string *)&seconds);
  }
  return;
}

Assistant:

void PatternParser::parseVariablePattern(Pattern* pattern, vector<string>& tokenList)
{
    // Formats are:
    //     PatternName  VARIABLE
    //     PatternName  time1  factor1  time2  factor2  ...

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... cast pattern to VariablePattern

    VariablePattern* varPat = static_cast<VariablePattern*>(pattern);

    // ... return if second token is the pattern type keyword

    if ( Utilities::match(tokens[1], "VARIABLE") ) return;

    // ... read in pairs of times and pattern factors
    //     (times can be in decimal hours or hours:minutes format)

    string timeUnits("");
    int    seconds;
    double factor;
    int i = 1;
    while ( i < nTokens )
    {
        seconds = Utilities::getSeconds(tokens[i], timeUnits);
        if ( seconds < 0 )
        {
            throw InputError(InputError::INVALID_TIME, tokens[i] + " " + timeUnits);
        }
        i++;
        if ( i >= nTokens ) throw InputError(InputError::TOO_FEW_ITEMS, "");
        if ( !Utilities::parseNumber(tokens[i], factor) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[i]);
        }
        varPat->addTime(seconds);
        varPat->addFactor(factor);
        i++;
    }
}